

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  int iVar1;
  Instruction *pIVar2;
  
  if (e->k == VVARARG) {
    pIVar2 = fs->f->code;
    iVar1 = (e->u).s.info;
    pIVar2[iVar1] = nresults * 0x800000 + (pIVar2[iVar1] & 0x7fffff) + 0x800000;
    iVar1 = (e->u).s.info;
    pIVar2[iVar1] = (fs->freereg & 0xffU) << 6 | pIVar2[iVar1] & 0xffffc03f;
    luaK_checkstack(fs,1);
    fs->freereg = fs->freereg + 1;
  }
  else if (e->k == VCALL) {
    pIVar2 = fs->f->code;
    iVar1 = (e->u).s.info;
    pIVar2[iVar1] = nresults * 0x4000 + 0x4000U & 0x7fc000 | pIVar2[iVar1] & 0xff803fff;
  }
  return;
}

Assistant:

static void luaK_setreturns(FuncState*fs,expdesc*e,int nresults){
if(e->k==VCALL){
SETARG_C(getcode(fs,e),nresults+1);
}
else if(e->k==VVARARG){
SETARG_B(getcode(fs,e),nresults+1);
SETARG_A(getcode(fs,e),fs->freereg);
luaK_reserveregs(fs,1);
}
}